

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O2

Program * get_program(void)

{
  Program *pPVar1;
  Queue *q;
  Queue *q_00;
  Queue *q_01;
  Map *tree;
  Linkage *pLVar2;
  
  pPVar1 = (Program *)malloc(0x28);
  q = (Queue *)malloc(0x18);
  pPVar1->translation_units = q;
  q_00 = (Queue *)malloc(0x18);
  pPVar1->source_files = q_00;
  q_01 = (Queue *)malloc(0x18);
  pPVar1->errors = q_01;
  tree = (Map *)malloc(0x810);
  pPVar1->types = tree;
  pLVar2 = (Linkage *)malloc(0x810);
  pPVar1->external_linkage = pLVar2;
  Queue_Init(q);
  Queue_Init(q_00);
  Queue_Init(q_01);
  Map_Init(tree);
  return pPVar1;
}

Assistant:

Program* get_program()
{
	struct Program *ret;
	ret=malloc(sizeof(struct Program));
	ret->translation_units=malloc(sizeof(struct Queue));
	ret->source_files=malloc(sizeof(struct Queue));
	ret->errors=malloc(sizeof(struct Queue));
	ret->types=malloc(sizeof(struct Map));
	ret->external_linkage=malloc(sizeof(struct Linkage));

	Queue_Init(ret->translation_units);
	Queue_Init(ret->source_files);
	Queue_Init(ret->errors);



	Map_Init(ret->types);

	return ret;
}